

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMarkers.cpp
# Opt level: O3

void __thiscall chrono::ChLinkMarkers::ConstraintsFbLoadForces(ChLinkMarkers *this,double factor)

{
  long *plVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  ChBodyFrame *pCVar36;
  ChMarker *pCVar37;
  ChBodyFrame *pCVar38;
  byte bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  bool bVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  int iVar56;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong *puVar57;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  Index index;
  ulong uVar58;
  uint uVar59;
  uint uVar60;
  ulong uVar61;
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined8 in_XMM0_Qb;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  double dVar97;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  Vector mbody_force;
  Vector mbody_torque;
  Vector m_abs_force;
  ChVector<double> local_118;
  long lStack_100;
  undefined1 auStack_f8 [16];
  long alStack_e8 [2];
  ChVector<double> CStack_d8;
  long lStack_c0;
  double local_b8;
  undefined8 uStack_b0;
  ChVectorRef local_a0;
  undefined1 local_88 [16];
  double local_78;
  double dStack_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  ChVector<double> local_28;
  
  if ((this->super_ChLink).Body1 == (ChBodyFrame *)0x0) {
    return;
  }
  pCVar36 = (this->super_ChLink).Body2;
  if (pCVar36 == (ChBodyFrame *)0x0) {
    return;
  }
  dVar97 = (this->C_force).m_data[0];
  auVar102._8_8_ = 0;
  auVar102._0_8_ = dVar97;
  dVar2 = (this->C_force).m_data[1];
  dVar3 = (this->C_force).m_data[2];
  auVar82._8_8_ = 0;
  auVar82._0_8_ = dVar3;
  local_b8 = factor;
  uStack_b0 = in_XMM0_Qb;
  if ((((dVar97 != 0.0) || (NAN(dVar97))) || (dVar2 != 0.0)) ||
     (((NAN(dVar2) || (dVar3 != 0.0)) || (NAN(dVar3))))) {
    local_118.m_data[2] = 0.0;
    local_118.m_data._0_16_ = ZEXT816(0);
    CStack_d8.m_data[2] = 0.0;
    CStack_d8.m_data[0] = 0.0;
    CStack_d8.m_data[1] = 0.0;
    pCVar37 = this->marker2;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[3];
    auVar98._8_8_ = 0;
    auVar98._0_8_ =
         dVar2 * (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
    auVar4 = vfmadd231sd_fma(auVar98,auVar102,auVar4);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[0];
    auVar93._8_8_ = 0;
    auVar93._0_8_ =
         dVar2 * (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
    auVar5 = vfmadd231sd_fma(auVar93,auVar102,auVar5);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[6];
    auVar89._8_8_ = 0;
    auVar89._0_8_ =
         dVar2 * (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7];
    auVar102 = vfmadd231sd_fma(auVar89,auVar102,auVar6);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[5];
    auVar4 = vfmadd231sd_fma(auVar4,auVar82,auVar7);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[2];
    auVar5 = vfmadd231sd_fma(auVar5,auVar82,auVar8);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[8];
    auVar82 = vfmadd231sd_fma(auVar102,auVar82,auVar9);
    dVar97 = auVar4._0_8_;
    auVar10._8_8_ = 0;
    auVar10._0_8_ =
         (pCVar36->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar73._8_8_ = 0;
    auVar73._0_8_ =
         dVar97 * (pCVar36->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[1];
    auVar102 = vfmadd231sd_fma(auVar73,auVar5,auVar10);
    auVar11._8_8_ = 0;
    auVar11._0_8_ =
         (pCVar36->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar83._8_8_ = 0;
    auVar83._0_8_ =
         dVar97 * (pCVar36->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[4];
    auVar4 = vfmadd231sd_fma(auVar83,auVar5,auVar11);
    auVar12._8_8_ = 0;
    auVar12._0_8_ =
         (pCVar36->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar99._8_8_ = 0;
    auVar99._0_8_ =
         dVar97 * (pCVar36->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[7];
    auVar5 = vfmadd231sd_fma(auVar99,auVar5,auVar12);
    auVar13._8_8_ = 0;
    auVar13._0_8_ =
         (pCVar36->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar102 = vfmadd231sd_fma(auVar102,auVar82,auVar13);
    auVar14._8_8_ = 0;
    auVar14._0_8_ =
         (pCVar36->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar4 = vfmadd231sd_fma(auVar4,auVar82,auVar14);
    auVar15._8_8_ = 0;
    auVar15._0_8_ =
         (pCVar36->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar82 = vfmadd231sd_fma(auVar5,auVar82,auVar15);
    local_28.m_data[0] = auVar102._0_8_;
    local_28.m_data[1] = auVar4._0_8_;
    local_28.m_data[2] = auVar82._0_8_;
    ChBodyFrame::To_abs_forcetorque
              (pCVar36,&local_28,&(this->marker1->abs_frame).super_ChFrame<double>.coord.pos,false,
               &local_118,&CStack_d8);
    iVar56 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
               _vptr_ChFrame[0x10])();
    ChVariables::Get_fb((ChVectorRef *)auStack_f8,(ChVariables *)CONCAT44(extraout_var,iVar56));
    if ((long)auStack_f8._8_8_ < 3) goto LAB_00580c6d;
    uVar58 = 3;
    if ((auStack_f8 & (undefined1  [16])0x7) == (undefined1  [16])0x0) {
      uVar59 = -((uint)((ulong)auStack_f8._0_8_ >> 3) & 0x1fffffff) & 7;
      if ((ulong)uVar59 < 3) {
        uVar58 = (ulong)uVar59;
      }
      if (uVar59 != 0) goto LAB_005805e2;
    }
    else {
LAB_005805e2:
      uVar61 = 0;
      do {
        *(double *)(auStack_f8._0_8_ + uVar61 * 8) =
             *(double *)(auStack_f8._0_8_ + uVar61 * 8) - local_b8 * local_118.m_data[uVar61];
        uVar61 = uVar61 + 1;
      } while (uVar58 != uVar61);
    }
    if (uVar58 < 3) {
      do {
        *(double *)(auStack_f8._0_8_ + uVar58 * 8) =
             *(double *)(auStack_f8._0_8_ + uVar58 * 8) - local_b8 * local_118.m_data[uVar58];
        uVar58 = uVar58 + 1;
      } while (uVar58 != 3);
    }
    pCVar36 = (this->super_ChLink).Body2;
    auVar90._8_8_ = CStack_d8.m_data[0];
    auVar90._0_8_ = CStack_d8.m_data[0];
    auVar94._8_8_ = CStack_d8.m_data[2];
    auVar94._0_8_ = CStack_d8.m_data[2];
    auVar74._0_8_ =
         CStack_d8.m_data[1] *
         (pCVar36->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar74._8_8_ =
         CStack_d8.m_data[1] *
         (pCVar36->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    auVar16._8_8_ = 0;
    auVar16._0_8_ =
         (pCVar36->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar84._8_8_ = 0;
    auVar84._0_8_ =
         CStack_d8.m_data[1] *
         (pCVar36->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar102 = vfmadd231sd_fma(auVar84,auVar90,auVar16);
    auVar82 = vfmadd231pd_fma(auVar74,auVar90,
                              *(undefined1 (*) [16])
                               (pCVar36->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                               super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array);
    auVar17._8_8_ = 0;
    auVar17._0_8_ =
         (pCVar36->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar102 = vfmadd231sd_fma(auVar102,auVar94,auVar17);
    auStack_f8 = vfmadd231pd_fma(auVar82,auVar94,
                                 *(undefined1 (*) [16])
                                  ((pCVar36->super_ChFrameMoving<double>).super_ChFrame<double>.
                                   Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                   m_storage.m_data.array + 6));
    alStack_e8[0] = auVar102._0_8_;
    iVar56 = (*(pCVar36->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])();
    ChVariables::Get_fb(&local_a0,(ChVariables *)CONCAT44(extraout_var_00,iVar56));
    if ((long)local_a0.
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              ._8_8_ < 6) goto LAB_00580c6d;
    auVar52._8_8_ = uStack_b0;
    auVar52._0_8_ = local_b8;
    uVar59 = 3;
    puVar57 = (ulong *)(local_a0.
                        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                        ._0_8_ + 0x18);
    if (((ulong)puVar57 & 7) == 0) {
      uVar60 = -((uint)((ulong)puVar57 >> 3) & 0x1fffffff) & 7;
      if (uVar60 < 3) {
        uVar59 = uVar60;
      }
      if (uVar60 != 0) goto LAB_005806bd;
    }
    else {
LAB_005806bd:
      auVar64 = vbroadcastsd_avx512f(auVar52);
      auVar65 = vpbroadcastq_avx512f();
      uVar58 = vpcmpuq_avx512f(auVar65,_DAT_00963d00,5);
      bVar39 = (byte)uVar58;
      auVar65._8_8_ = (ulong)((byte)(uVar58 >> 1) & 1) * auStack_f8._8_8_;
      auVar65._0_8_ = (ulong)(bVar39 & 1) * auStack_f8._0_8_;
      auVar65._16_8_ = (ulong)((byte)(uVar58 >> 2) & 1) * alStack_e8[0];
      auVar65._24_8_ = (ulong)((byte)(uVar58 >> 3) & 1) * alStack_e8[1];
      auVar65._32_8_ = (ulong)((byte)(uVar58 >> 4) & 1) * (long)CStack_d8.m_data[0];
      auVar65._40_8_ = (ulong)((byte)(uVar58 >> 5) & 1) * (long)CStack_d8.m_data[1];
      auVar65._48_8_ = (ulong)((byte)(uVar58 >> 6) & 1) * (long)CStack_d8.m_data[2];
      auVar65._56_8_ = (uVar58 >> 7) * lStack_c0;
      auVar66._8_8_ =
           (ulong)((byte)(uVar58 >> 1) & 1) *
           *(long *)(local_a0.
                     super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                     ._0_8_ + 0x20);
      auVar66._0_8_ = (ulong)(bVar39 & 1) * *puVar57;
      auVar66._16_8_ =
           (ulong)((byte)(uVar58 >> 2) & 1) *
           *(long *)(local_a0.
                     super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                     ._0_8_ + 0x28);
      auVar66._24_8_ =
           (ulong)((byte)(uVar58 >> 3) & 1) *
           *(long *)(local_a0.
                     super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                     ._0_8_ + 0x30);
      auVar66._32_8_ =
           (ulong)((byte)(uVar58 >> 4) & 1) *
           *(long *)(local_a0.
                     super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                     ._0_8_ + 0x38);
      auVar66._40_8_ =
           (ulong)((byte)(uVar58 >> 5) & 1) *
           *(long *)(local_a0.
                     super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                     ._0_8_ + 0x40);
      auVar66._48_8_ =
           (ulong)((byte)(uVar58 >> 6) & 1) *
           *(long *)(local_a0.
                     super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                     ._0_8_ + 0x48);
      auVar66._56_8_ =
           (uVar58 >> 7) *
           *(long *)(local_a0.
                     super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                     ._0_8_ + 0x50);
      auVar64 = vmulpd_avx512f(auVar65,auVar64);
      auVar64 = vsubpd_avx512f(auVar66,auVar64);
      bVar40 = (bool)((byte)(uVar58 >> 1) & 1);
      bVar41 = (bool)((byte)(uVar58 >> 2) & 1);
      bVar42 = (bool)((byte)(uVar58 >> 3) & 1);
      bVar43 = (bool)((byte)(uVar58 >> 4) & 1);
      bVar44 = (bool)((byte)(uVar58 >> 5) & 1);
      bVar45 = (bool)((byte)(uVar58 >> 6) & 1);
      *puVar57 = (ulong)(bVar39 & 1) * auVar64._0_8_ | (ulong)!(bool)(bVar39 & 1) * *puVar57;
      *(ulong *)(local_a0.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + 0x20) =
           (ulong)bVar40 * auVar64._8_8_ |
           (ulong)!bVar40 *
           *(long *)(local_a0.
                     super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                     ._0_8_ + 0x20);
      *(ulong *)(local_a0.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + 0x28) =
           (ulong)bVar41 * auVar64._16_8_ |
           (ulong)!bVar41 *
           *(long *)(local_a0.
                     super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                     ._0_8_ + 0x28);
      *(ulong *)(local_a0.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + 0x30) =
           (ulong)bVar42 * auVar64._24_8_ |
           (ulong)!bVar42 *
           *(long *)(local_a0.
                     super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                     ._0_8_ + 0x30);
      *(ulong *)(local_a0.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + 0x38) =
           (ulong)bVar43 * auVar64._32_8_ |
           (ulong)!bVar43 *
           *(long *)(local_a0.
                     super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                     ._0_8_ + 0x38);
      *(ulong *)(local_a0.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + 0x40) =
           (ulong)bVar44 * auVar64._40_8_ |
           (ulong)!bVar44 *
           *(long *)(local_a0.
                     super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                     ._0_8_ + 0x40);
      *(ulong *)(local_a0.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + 0x48) =
           (ulong)bVar45 * auVar64._48_8_ |
           (ulong)!bVar45 *
           *(long *)(local_a0.
                     super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                     ._0_8_ + 0x48);
      *(ulong *)(local_a0.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + 0x50) =
           (uVar58 >> 7) * auVar64._56_8_ |
           (ulong)!SUB81(uVar58 >> 7,0) *
           *(long *)(local_a0.
                     super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                     ._0_8_ + 0x50);
    }
    if (uVar59 < 3) {
      uVar61 = (ulong)(uVar59 << 3);
      auVar62 = vpbroadcastq_avx512vl();
      uVar58 = vpcmpuq_avx512vl(auVar62,_DAT_00955380,5);
      uVar58 = uVar58 & 0xf;
      bVar39 = (byte)uVar58;
      plVar1 = (long *)((long)puVar57 + uVar61);
      auVar62._8_8_ = (ulong)((byte)(uVar58 >> 1) & 1) * plVar1[1];
      auVar62._0_8_ = (ulong)(bVar39 & 1) * *plVar1;
      auVar62._16_8_ = (ulong)((byte)(uVar58 >> 2) & 1) * plVar1[2];
      auVar62._24_8_ = (uVar58 >> 3) * plVar1[3];
      auVar80._0_8_ = (double)((ulong)(bVar39 & 1) * *(long *)(auStack_f8 + uVar61)) * local_b8;
      auVar80._8_8_ =
           (double)((ulong)((byte)(uVar58 >> 1) & 1) * *(long *)(auStack_f8 + uVar61 + 8)) *
           local_b8;
      auVar80._16_8_ =
           (double)((ulong)((byte)(uVar58 >> 2) & 1) * *(long *)((long)alStack_e8 + uVar61)) *
           local_b8;
      auVar80._24_8_ = (double)((uVar58 >> 3) * *(long *)((long)alStack_e8 + uVar61 + 8)) * local_b8
      ;
      auVar62 = vsubpd_avx(auVar62,auVar80);
      puVar57 = (ulong *)((long)puVar57 + uVar61);
      bVar40 = (bool)((byte)(uVar58 >> 1) & 1);
      bVar41 = (bool)((byte)(uVar58 >> 2) & 1);
      *puVar57 = (ulong)(bVar39 & 1) * auVar62._0_8_ | (ulong)!(bool)(bVar39 & 1) * *puVar57;
      puVar57[1] = (ulong)bVar40 * auVar62._8_8_ | (ulong)!bVar40 * puVar57[1];
      puVar57[2] = (ulong)bVar41 * auVar62._16_8_ | (ulong)!bVar41 * puVar57[2];
      puVar57[3] = (uVar58 >> 3) * auVar62._24_8_ | (ulong)!SUB81(uVar58 >> 3,0) * puVar57[3];
    }
    ChBodyFrame::To_abs_forcetorque
              ((this->super_ChLink).Body1,&local_28,
               &(this->marker1->abs_frame).super_ChFrame<double>.coord.pos,false,&local_118,
               &CStack_d8);
    iVar56 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
               _vptr_ChFrame[0x10])();
    ChVariables::Get_fb((ChVectorRef *)auStack_f8,(ChVariables *)CONCAT44(extraout_var_01,iVar56));
    if ((long)auStack_f8._8_8_ < 3) goto LAB_00580c6d;
    uVar58 = 3;
    if ((auStack_f8 & (undefined1  [16])0x7) == (undefined1  [16])0x0) {
      uVar59 = -((uint)((ulong)auStack_f8._0_8_ >> 3) & 0x1fffffff) & 7;
      if ((ulong)uVar59 < 3) {
        uVar58 = (ulong)uVar59;
      }
      if (uVar59 != 0) goto LAB_005807bc;
    }
    else {
LAB_005807bc:
      uVar61 = 0;
      do {
        *(double *)(auStack_f8._0_8_ + uVar61 * 8) =
             local_b8 * local_118.m_data[uVar61] + *(double *)(auStack_f8._0_8_ + uVar61 * 8);
        uVar61 = uVar61 + 1;
      } while (uVar58 != uVar61);
    }
    if (uVar58 < 3) {
      do {
        *(double *)(auStack_f8._0_8_ + uVar58 * 8) =
             local_b8 * local_118.m_data[uVar58] + *(double *)(auStack_f8._0_8_ + uVar58 * 8);
        uVar58 = uVar58 + 1;
      } while (uVar58 != 3);
    }
    pCVar36 = (this->super_ChLink).Body1;
    auVar91._8_8_ = CStack_d8.m_data[0];
    auVar91._0_8_ = CStack_d8.m_data[0];
    auVar95._8_8_ = CStack_d8.m_data[2];
    auVar95._0_8_ = CStack_d8.m_data[2];
    auVar75._0_8_ =
         CStack_d8.m_data[1] *
         (pCVar36->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar75._8_8_ =
         CStack_d8.m_data[1] *
         (pCVar36->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    auVar18._8_8_ = 0;
    auVar18._0_8_ =
         (pCVar36->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar85._8_8_ = 0;
    auVar85._0_8_ =
         CStack_d8.m_data[1] *
         (pCVar36->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar102 = vfmadd231sd_fma(auVar85,auVar91,auVar18);
    auVar82 = vfmadd231pd_fma(auVar75,auVar91,
                              *(undefined1 (*) [16])
                               (pCVar36->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                               super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array);
    auVar19._8_8_ = 0;
    auVar19._0_8_ =
         (pCVar36->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar102 = vfmadd231sd_fma(auVar102,auVar95,auVar19);
    auStack_f8 = vfmadd231pd_fma(auVar82,auVar95,
                                 *(undefined1 (*) [16])
                                  ((pCVar36->super_ChFrameMoving<double>).super_ChFrame<double>.
                                   Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                   m_storage.m_data.array + 6));
    alStack_e8[0] = auVar102._0_8_;
    iVar56 = (*(pCVar36->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])();
    ChVariables::Get_fb(&local_a0,(ChVariables *)CONCAT44(extraout_var_02,iVar56));
    if ((long)local_a0.
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              ._8_8_ < 6) goto LAB_00580c6d;
    auVar53._8_8_ = uStack_b0;
    auVar53._0_8_ = local_b8;
    uVar59 = 3;
    puVar57 = (ulong *)(local_a0.
                        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                        ._0_8_ + 0x18);
    if (((ulong)puVar57 & 7) == 0) {
      uVar60 = -((uint)((ulong)puVar57 >> 3) & 0x1fffffff) & 7;
      if (uVar60 < 3) {
        uVar59 = uVar60;
      }
      if (uVar60 != 0) goto LAB_0058088c;
    }
    else {
LAB_0058088c:
      auVar64 = vbroadcastsd_avx512f(auVar53);
      auVar65 = vpbroadcastq_avx512f();
      uVar58 = vpcmpuq_avx512f(auVar65,_DAT_00963d00,5);
      bVar39 = (byte)uVar58;
      auVar67._8_8_ = (ulong)((byte)(uVar58 >> 1) & 1) * auStack_f8._8_8_;
      auVar67._0_8_ = (ulong)(bVar39 & 1) * auStack_f8._0_8_;
      auVar67._16_8_ = (ulong)((byte)(uVar58 >> 2) & 1) * alStack_e8[0];
      auVar67._24_8_ = (ulong)((byte)(uVar58 >> 3) & 1) * alStack_e8[1];
      auVar67._32_8_ = (ulong)((byte)(uVar58 >> 4) & 1) * (long)CStack_d8.m_data[0];
      auVar67._40_8_ = (ulong)((byte)(uVar58 >> 5) & 1) * (long)CStack_d8.m_data[1];
      auVar67._48_8_ = (ulong)((byte)(uVar58 >> 6) & 1) * (long)CStack_d8.m_data[2];
      auVar67._56_8_ = (uVar58 >> 7) * lStack_c0;
      auVar68._8_8_ =
           (ulong)((byte)(uVar58 >> 1) & 1) *
           *(long *)(local_a0.
                     super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                     ._0_8_ + 0x20);
      auVar68._0_8_ = (ulong)(bVar39 & 1) * *puVar57;
      auVar68._16_8_ =
           (ulong)((byte)(uVar58 >> 2) & 1) *
           *(long *)(local_a0.
                     super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                     ._0_8_ + 0x28);
      auVar68._24_8_ =
           (ulong)((byte)(uVar58 >> 3) & 1) *
           *(long *)(local_a0.
                     super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                     ._0_8_ + 0x30);
      auVar68._32_8_ =
           (ulong)((byte)(uVar58 >> 4) & 1) *
           *(long *)(local_a0.
                     super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                     ._0_8_ + 0x38);
      auVar68._40_8_ =
           (ulong)((byte)(uVar58 >> 5) & 1) *
           *(long *)(local_a0.
                     super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                     ._0_8_ + 0x40);
      auVar68._48_8_ =
           (ulong)((byte)(uVar58 >> 6) & 1) *
           *(long *)(local_a0.
                     super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                     ._0_8_ + 0x48);
      auVar68._56_8_ =
           (uVar58 >> 7) *
           *(long *)(local_a0.
                     super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                     ._0_8_ + 0x50);
      auVar64 = vmulpd_avx512f(auVar67,auVar64);
      auVar64 = vaddpd_avx512f(auVar64,auVar68);
      bVar40 = (bool)((byte)(uVar58 >> 1) & 1);
      bVar41 = (bool)((byte)(uVar58 >> 2) & 1);
      bVar42 = (bool)((byte)(uVar58 >> 3) & 1);
      bVar43 = (bool)((byte)(uVar58 >> 4) & 1);
      bVar44 = (bool)((byte)(uVar58 >> 5) & 1);
      bVar45 = (bool)((byte)(uVar58 >> 6) & 1);
      *puVar57 = (ulong)(bVar39 & 1) * auVar64._0_8_ | (ulong)!(bool)(bVar39 & 1) * *puVar57;
      *(ulong *)(local_a0.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + 0x20) =
           (ulong)bVar40 * auVar64._8_8_ |
           (ulong)!bVar40 *
           *(long *)(local_a0.
                     super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                     ._0_8_ + 0x20);
      *(ulong *)(local_a0.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + 0x28) =
           (ulong)bVar41 * auVar64._16_8_ |
           (ulong)!bVar41 *
           *(long *)(local_a0.
                     super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                     ._0_8_ + 0x28);
      *(ulong *)(local_a0.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + 0x30) =
           (ulong)bVar42 * auVar64._24_8_ |
           (ulong)!bVar42 *
           *(long *)(local_a0.
                     super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                     ._0_8_ + 0x30);
      *(ulong *)(local_a0.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + 0x38) =
           (ulong)bVar43 * auVar64._32_8_ |
           (ulong)!bVar43 *
           *(long *)(local_a0.
                     super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                     ._0_8_ + 0x38);
      *(ulong *)(local_a0.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + 0x40) =
           (ulong)bVar44 * auVar64._40_8_ |
           (ulong)!bVar44 *
           *(long *)(local_a0.
                     super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                     ._0_8_ + 0x40);
      *(ulong *)(local_a0.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + 0x48) =
           (ulong)bVar45 * auVar64._48_8_ |
           (ulong)!bVar45 *
           *(long *)(local_a0.
                     super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                     ._0_8_ + 0x48);
      *(ulong *)(local_a0.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + 0x50) =
           (uVar58 >> 7) * auVar64._56_8_ |
           (ulong)!SUB81(uVar58 >> 7,0) *
           *(long *)(local_a0.
                     super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                     ._0_8_ + 0x50);
    }
    if (uVar59 < 3) {
      uVar61 = (ulong)(uVar59 << 3);
      auVar62 = vpbroadcastq_avx512vl();
      uVar58 = vpcmpuq_avx512vl(auVar62,_DAT_00955380,5);
      uVar58 = uVar58 & 0xf;
      lVar46 = *(long *)(auStack_f8 + uVar61 + 8);
      lVar47 = *(long *)((long)alStack_e8 + uVar61);
      lVar48 = *(long *)((long)alStack_e8 + uVar61 + 8);
      bVar39 = (byte)uVar58;
      plVar1 = (long *)((long)puVar57 + uVar61);
      lVar49 = plVar1[1];
      lVar50 = plVar1[2];
      lVar51 = plVar1[3];
      puVar57 = (ulong *)((long)puVar57 + uVar61);
      bVar40 = (bool)((byte)(uVar58 >> 1) & 1);
      bVar41 = (bool)((byte)(uVar58 >> 2) & 1);
      *puVar57 = (ulong)(bVar39 & 1) *
                 (long)((double)((ulong)(bVar39 & 1) * *(long *)(auStack_f8 + uVar61)) * local_b8 +
                       (double)((ulong)(bVar39 & 1) * *plVar1)) |
                 (ulong)!(bool)(bVar39 & 1) * *puVar57;
      puVar57[1] = (ulong)bVar40 *
                   (long)((double)((ulong)((byte)(uVar58 >> 1) & 1) * lVar46) * local_b8 +
                         (double)((ulong)((byte)(uVar58 >> 1) & 1) * lVar49)) |
                   (ulong)!bVar40 * puVar57[1];
      puVar57[2] = (ulong)bVar41 *
                   (long)((double)((ulong)((byte)(uVar58 >> 2) & 1) * lVar47) * local_b8 +
                         (double)((ulong)((byte)(uVar58 >> 2) & 1) * lVar50)) |
                   (ulong)!bVar41 * puVar57[2];
      puVar57[3] = (uVar58 >> 3) *
                   (long)((double)((uVar58 >> 3) * lVar48) * local_b8 +
                         (double)((uVar58 >> 3) * lVar51)) |
                   (ulong)!SUB81(uVar58 >> 3,0) * puVar57[3];
    }
  }
  dVar97 = (this->C_torque).m_data[0];
  auVar76._8_8_ = 0;
  auVar76._0_8_ = dVar97;
  dVar2 = (this->C_torque).m_data[1];
  dVar3 = (this->C_torque).m_data[2];
  auVar86._8_8_ = 0;
  auVar86._0_8_ = dVar3;
  if (((dVar97 == 0.0) && (!NAN(dVar97))) &&
     ((dVar2 == 0.0 && (((!NAN(dVar2) && (dVar3 == 0.0)) && (!NAN(dVar3))))))) {
    return;
  }
  pCVar37 = this->marker2;
  pCVar36 = (this->super_ChLink).Body2;
  pCVar38 = (this->super_ChLink).Body1;
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar100._8_8_ = 0;
  auVar100._0_8_ =
       dVar2 * (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
               super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [4];
  auVar82 = vfmadd231sd_fma(auVar100,auVar76,auVar20);
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar96._8_8_ = 0;
  auVar96._0_8_ =
       dVar2 * (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
               super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [1];
  auVar102 = vfmadd231sd_fma(auVar96,auVar76,auVar21);
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar92._8_8_ = 0;
  auVar92._0_8_ =
       dVar2 * (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
               super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [7];
  auVar4 = vfmadd231sd_fma(auVar92,auVar76,auVar22);
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar82 = vfmadd231sd_fma(auVar82,auVar86,auVar23);
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar102 = vfmadd231sd_fma(auVar102,auVar86,auVar24);
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar4 = vfmadd231sd_fma(auVar4,auVar86,auVar25);
  dVar97 = auVar82._0_8_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       (pCVar36->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar87._8_8_ = 0;
  auVar87._0_8_ =
       dVar97 * (pCVar36->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [4];
  auVar82 = vfmadd231sd_fma(auVar87,auVar102,auVar26);
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       (pCVar36->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar103._8_8_ = 0;
  auVar103._0_8_ =
       dVar97 * (pCVar36->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [1];
  auVar5 = vfmadd231sd_fma(auVar103,auVar102,auVar27);
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       (pCVar36->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar101._8_8_ = 0;
  auVar101._0_8_ =
       dVar97 * (pCVar36->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [7];
  auVar102 = vfmadd231sd_fma(auVar101,auVar102,auVar28);
  auVar29._8_8_ = 0;
  auVar29._0_8_ =
       (pCVar36->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  local_58 = vfmadd231sd_fma(auVar82,auVar4,auVar29);
  auVar30._8_8_ = 0;
  auVar30._0_8_ =
       (pCVar36->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  local_38 = vfmadd231sd_fma(auVar5,auVar4,auVar30);
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       (pCVar36->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  local_48 = vfmadd231sd_fma(auVar102,auVar4,auVar31);
  local_78 = local_58._0_8_;
  auVar32._8_8_ = 0;
  auVar32._0_8_ =
       (pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar77._8_8_ = 0;
  auVar77._0_8_ =
       local_78 *
       (pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar82 = vfmadd231sd_fma(auVar77,local_38,auVar32);
  local_68._8_8_ = local_38._0_8_;
  local_68._0_8_ = local_38._0_8_;
  auVar33._8_8_ = 0;
  auVar33._0_8_ =
       (pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar102 = vfmadd231sd_fma(auVar82,local_48,auVar33);
  auVar88._0_8_ =
       local_78 *
       (pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar88._8_8_ =
       local_78 *
       (pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar82 = vfmadd231pd_fma(auVar88,local_68,
                            *(undefined1 (*) [16])
                             (pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                             super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array);
  local_88._8_8_ = local_48._0_8_;
  local_88._0_8_ = local_48._0_8_;
  local_118.m_data._0_16_ =
       vfmadd231pd_fma(auVar82,local_88,
                       *(undefined1 (*) [16])
                        ((pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + 6));
  local_118.m_data[2] = auVar102._0_8_;
  dStack_70 = local_78;
  iVar56 = (*(pCVar38->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])();
  ChVariables::Get_fb((ChVectorRef *)&CStack_d8,(ChVariables *)CONCAT44(extraout_var_03,iVar56));
  if ((long)CStack_d8.m_data[1] < 6) goto LAB_00580c6d;
  auVar54._8_8_ = uStack_b0;
  auVar54._0_8_ = local_b8;
  uVar59 = 3;
  puVar57 = (ulong *)((long)CStack_d8.m_data[0] + 0x18);
  if (((ulong)puVar57 & 7) == 0) {
    uVar60 = -((uint)((ulong)puVar57 >> 3) & 0x1fffffff) & 7;
    if (uVar60 < 3) {
      uVar59 = uVar60;
    }
    if (uVar60 != 0) goto LAB_00580aa1;
  }
  else {
LAB_00580aa1:
    auVar64 = vbroadcastsd_avx512f(auVar54);
    auVar65 = vpbroadcastq_avx512f();
    uVar58 = vpcmpuq_avx512f(auVar65,_DAT_00963d00,5);
    bVar39 = (byte)uVar58;
    auVar69._8_8_ = (ulong)((byte)(uVar58 >> 1) & 1) * (long)local_118.m_data[1];
    auVar69._0_8_ = (ulong)(bVar39 & 1) * (long)local_118.m_data[0];
    auVar69._16_8_ = (ulong)((byte)(uVar58 >> 2) & 1) * (long)local_118.m_data[2];
    auVar69._24_8_ = (ulong)((byte)(uVar58 >> 3) & 1) * lStack_100;
    auVar69._32_8_ = (ulong)((byte)(uVar58 >> 4) & 1) * auStack_f8._0_8_;
    auVar69._40_8_ = (ulong)((byte)(uVar58 >> 5) & 1) * auStack_f8._8_8_;
    auVar69._48_8_ = (ulong)((byte)(uVar58 >> 6) & 1) * alStack_e8[0];
    auVar69._56_8_ = (uVar58 >> 7) * alStack_e8[1];
    auVar70._8_8_ = (ulong)((byte)(uVar58 >> 1) & 1) * *(long *)((long)CStack_d8.m_data[0] + 0x20);
    auVar70._0_8_ = (ulong)(bVar39 & 1) * *puVar57;
    auVar70._16_8_ = (ulong)((byte)(uVar58 >> 2) & 1) * *(long *)((long)CStack_d8.m_data[0] + 0x28);
    auVar70._24_8_ = (ulong)((byte)(uVar58 >> 3) & 1) * *(long *)((long)CStack_d8.m_data[0] + 0x30);
    auVar70._32_8_ = (ulong)((byte)(uVar58 >> 4) & 1) * *(long *)((long)CStack_d8.m_data[0] + 0x38);
    auVar70._40_8_ = (ulong)((byte)(uVar58 >> 5) & 1) * *(long *)((long)CStack_d8.m_data[0] + 0x40);
    auVar70._48_8_ = (ulong)((byte)(uVar58 >> 6) & 1) * *(long *)((long)CStack_d8.m_data[0] + 0x48);
    auVar70._56_8_ = (uVar58 >> 7) * *(long *)((long)CStack_d8.m_data[0] + 0x50);
    auVar64 = vmulpd_avx512f(auVar69,auVar64);
    auVar64 = vaddpd_avx512f(auVar64,auVar70);
    bVar40 = (bool)((byte)(uVar58 >> 1) & 1);
    bVar41 = (bool)((byte)(uVar58 >> 2) & 1);
    bVar42 = (bool)((byte)(uVar58 >> 3) & 1);
    bVar43 = (bool)((byte)(uVar58 >> 4) & 1);
    bVar44 = (bool)((byte)(uVar58 >> 5) & 1);
    bVar45 = (bool)((byte)(uVar58 >> 6) & 1);
    *puVar57 = (ulong)(bVar39 & 1) * auVar64._0_8_ | (ulong)!(bool)(bVar39 & 1) * *puVar57;
    *(ulong *)((long)CStack_d8.m_data[0] + 0x20) =
         (ulong)bVar40 * auVar64._8_8_ |
         (ulong)!bVar40 * *(long *)((long)CStack_d8.m_data[0] + 0x20);
    *(ulong *)((long)CStack_d8.m_data[0] + 0x28) =
         (ulong)bVar41 * auVar64._16_8_ |
         (ulong)!bVar41 * *(long *)((long)CStack_d8.m_data[0] + 0x28);
    *(ulong *)((long)CStack_d8.m_data[0] + 0x30) =
         (ulong)bVar42 * auVar64._24_8_ |
         (ulong)!bVar42 * *(long *)((long)CStack_d8.m_data[0] + 0x30);
    *(ulong *)((long)CStack_d8.m_data[0] + 0x38) =
         (ulong)bVar43 * auVar64._32_8_ |
         (ulong)!bVar43 * *(long *)((long)CStack_d8.m_data[0] + 0x38);
    *(ulong *)((long)CStack_d8.m_data[0] + 0x40) =
         (ulong)bVar44 * auVar64._40_8_ |
         (ulong)!bVar44 * *(long *)((long)CStack_d8.m_data[0] + 0x40);
    *(ulong *)((long)CStack_d8.m_data[0] + 0x48) =
         (ulong)bVar45 * auVar64._48_8_ |
         (ulong)!bVar45 * *(long *)((long)CStack_d8.m_data[0] + 0x48);
    *(ulong *)((long)CStack_d8.m_data[0] + 0x50) =
         (uVar58 >> 7) * auVar64._56_8_ |
         (ulong)!SUB81(uVar58 >> 7,0) * *(long *)((long)CStack_d8.m_data[0] + 0x50);
  }
  if (uVar59 < 3) {
    uVar61 = (ulong)(uVar59 << 3);
    auVar62 = vpbroadcastq_avx512vl();
    uVar58 = vpcmpuq_avx512vl(auVar62,_DAT_00955380,5);
    uVar58 = uVar58 & 0xf;
    lVar46 = *(long *)((long)local_118.m_data + uVar61 + 8);
    lVar47 = *(long *)((long)local_118.m_data + uVar61 + 0x10);
    lVar48 = *(long *)(auStack_f8 + (uVar61 - 8));
    bVar39 = (byte)uVar58;
    plVar1 = (long *)((long)puVar57 + uVar61);
    lVar49 = plVar1[1];
    lVar50 = plVar1[2];
    lVar51 = plVar1[3];
    puVar57 = (ulong *)((long)puVar57 + uVar61);
    bVar40 = (bool)((byte)(uVar58 >> 1) & 1);
    bVar41 = (bool)((byte)(uVar58 >> 2) & 1);
    *puVar57 = (ulong)(bVar39 & 1) *
               (long)((double)((ulong)(bVar39 & 1) * *(long *)((long)local_118.m_data + uVar61)) *
                      local_b8 + (double)((ulong)(bVar39 & 1) * *plVar1)) |
               (ulong)!(bool)(bVar39 & 1) * *puVar57;
    puVar57[1] = (ulong)bVar40 *
                 (long)((double)((ulong)((byte)(uVar58 >> 1) & 1) * lVar46) * local_b8 +
                       (double)((ulong)((byte)(uVar58 >> 1) & 1) * lVar49)) |
                 (ulong)!bVar40 * puVar57[1];
    puVar57[2] = (ulong)bVar41 *
                 (long)((double)((ulong)((byte)(uVar58 >> 2) & 1) * lVar47) * local_b8 +
                       (double)((ulong)((byte)(uVar58 >> 2) & 1) * lVar50)) |
                 (ulong)!bVar41 * puVar57[2];
    puVar57[3] = (uVar58 >> 3) *
                 (long)((double)((uVar58 >> 3) * lVar48) * local_b8 +
                       (double)((uVar58 >> 3) * lVar51)) | (ulong)!SUB81(uVar58 >> 3,0) * puVar57[3]
    ;
  }
  pCVar36 = (this->super_ChLink).Body2;
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       (pCVar36->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar78._8_8_ = 0;
  auVar78._0_8_ =
       (double)local_58._0_8_ *
       (pCVar36->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar102 = vfmadd132sd_fma(local_38,auVar78,auVar34);
  auVar79._0_8_ =
       local_78 *
       (pCVar36->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar79._8_8_ =
       dStack_70 *
       (pCVar36->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar82 = vfmadd132pd_fma(local_68,auVar79,
                            *(undefined1 (*) [16])
                             (pCVar36->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                             super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array);
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       (pCVar36->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar102 = vfmadd132sd_fma(local_48,auVar102,auVar35);
  local_118.m_data._0_16_ =
       vfmadd132pd_fma(local_88,auVar82,
                       *(undefined1 (*) [16])
                        ((pCVar36->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + 6));
  local_118.m_data[2] = auVar102._0_8_;
  iVar56 = (*(pCVar36->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])();
  ChVariables::Get_fb((ChVectorRef *)&CStack_d8,(ChVariables *)CONCAT44(extraout_var_04,iVar56));
  if ((long)CStack_d8.m_data[1] < 6) {
LAB_00580c6d:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  auVar55._8_8_ = uStack_b0;
  auVar55._0_8_ = local_b8;
  uVar59 = 3;
  puVar57 = (ulong *)((long)CStack_d8.m_data[0] + 0x18);
  if (((ulong)puVar57 & 7) == 0) {
    uVar60 = -((uint)((ulong)puVar57 >> 3) & 0x1fffffff) & 7;
    if (uVar60 < 3) {
      uVar59 = uVar60;
    }
    if (uVar60 == 0) goto LAB_00580c1b;
  }
  auVar64 = vbroadcastsd_avx512f(auVar55);
  auVar65 = vpbroadcastq_avx512f();
  uVar58 = vpcmpuq_avx512f(auVar65,_DAT_00963d00,5);
  bVar39 = (byte)uVar58;
  auVar71._8_8_ = (ulong)((byte)(uVar58 >> 1) & 1) * (long)local_118.m_data[1];
  auVar71._0_8_ = (ulong)(bVar39 & 1) * (long)local_118.m_data[0];
  auVar71._16_8_ = (ulong)((byte)(uVar58 >> 2) & 1) * (long)local_118.m_data[2];
  auVar71._24_8_ = (ulong)((byte)(uVar58 >> 3) & 1) * lStack_100;
  auVar71._32_8_ = (ulong)((byte)(uVar58 >> 4) & 1) * auStack_f8._0_8_;
  auVar71._40_8_ = (ulong)((byte)(uVar58 >> 5) & 1) * auStack_f8._8_8_;
  auVar71._48_8_ = (ulong)((byte)(uVar58 >> 6) & 1) * alStack_e8[0];
  auVar71._56_8_ = (uVar58 >> 7) * alStack_e8[1];
  auVar72._8_8_ = (ulong)((byte)(uVar58 >> 1) & 1) * *(long *)((long)CStack_d8.m_data[0] + 0x20);
  auVar72._0_8_ = (ulong)(bVar39 & 1) * *puVar57;
  auVar72._16_8_ = (ulong)((byte)(uVar58 >> 2) & 1) * *(long *)((long)CStack_d8.m_data[0] + 0x28);
  auVar72._24_8_ = (ulong)((byte)(uVar58 >> 3) & 1) * *(long *)((long)CStack_d8.m_data[0] + 0x30);
  auVar72._32_8_ = (ulong)((byte)(uVar58 >> 4) & 1) * *(long *)((long)CStack_d8.m_data[0] + 0x38);
  auVar72._40_8_ = (ulong)((byte)(uVar58 >> 5) & 1) * *(long *)((long)CStack_d8.m_data[0] + 0x40);
  auVar72._48_8_ = (ulong)((byte)(uVar58 >> 6) & 1) * *(long *)((long)CStack_d8.m_data[0] + 0x48);
  auVar72._56_8_ = (uVar58 >> 7) * *(long *)((long)CStack_d8.m_data[0] + 0x50);
  auVar64 = vmulpd_avx512f(auVar71,auVar64);
  auVar64 = vsubpd_avx512f(auVar72,auVar64);
  bVar40 = (bool)((byte)(uVar58 >> 1) & 1);
  bVar41 = (bool)((byte)(uVar58 >> 2) & 1);
  bVar42 = (bool)((byte)(uVar58 >> 3) & 1);
  bVar43 = (bool)((byte)(uVar58 >> 4) & 1);
  bVar44 = (bool)((byte)(uVar58 >> 5) & 1);
  bVar45 = (bool)((byte)(uVar58 >> 6) & 1);
  *puVar57 = (ulong)(bVar39 & 1) * auVar64._0_8_ | (ulong)!(bool)(bVar39 & 1) * *puVar57;
  *(ulong *)((long)CStack_d8.m_data[0] + 0x20) =
       (ulong)bVar40 * auVar64._8_8_ | (ulong)!bVar40 * *(long *)((long)CStack_d8.m_data[0] + 0x20);
  *(ulong *)((long)CStack_d8.m_data[0] + 0x28) =
       (ulong)bVar41 * auVar64._16_8_ | (ulong)!bVar41 * *(long *)((long)CStack_d8.m_data[0] + 0x28)
  ;
  *(ulong *)((long)CStack_d8.m_data[0] + 0x30) =
       (ulong)bVar42 * auVar64._24_8_ | (ulong)!bVar42 * *(long *)((long)CStack_d8.m_data[0] + 0x30)
  ;
  *(ulong *)((long)CStack_d8.m_data[0] + 0x38) =
       (ulong)bVar43 * auVar64._32_8_ | (ulong)!bVar43 * *(long *)((long)CStack_d8.m_data[0] + 0x38)
  ;
  *(ulong *)((long)CStack_d8.m_data[0] + 0x40) =
       (ulong)bVar44 * auVar64._40_8_ | (ulong)!bVar44 * *(long *)((long)CStack_d8.m_data[0] + 0x40)
  ;
  *(ulong *)((long)CStack_d8.m_data[0] + 0x48) =
       (ulong)bVar45 * auVar64._48_8_ | (ulong)!bVar45 * *(long *)((long)CStack_d8.m_data[0] + 0x48)
  ;
  *(ulong *)((long)CStack_d8.m_data[0] + 0x50) =
       (uVar58 >> 7) * auVar64._56_8_ |
       (ulong)!SUB81(uVar58 >> 7,0) * *(long *)((long)CStack_d8.m_data[0] + 0x50);
LAB_00580c1b:
  if (uVar59 < 3) {
    uVar61 = (ulong)(uVar59 << 3);
    auVar62 = vpbroadcastq_avx512vl();
    uVar58 = vpcmpuq_avx512vl(auVar62,_DAT_00955380,5);
    uVar58 = uVar58 & 0xf;
    bVar39 = (byte)uVar58;
    plVar1 = (long *)((long)puVar57 + uVar61);
    auVar63._8_8_ = (ulong)((byte)(uVar58 >> 1) & 1) * plVar1[1];
    auVar63._0_8_ = (ulong)(bVar39 & 1) * *plVar1;
    auVar63._16_8_ = (ulong)((byte)(uVar58 >> 2) & 1) * plVar1[2];
    auVar63._24_8_ = (uVar58 >> 3) * plVar1[3];
    auVar81._0_8_ =
         (double)((ulong)(bVar39 & 1) * *(long *)((long)local_118.m_data + uVar61)) * local_b8;
    auVar81._8_8_ =
         (double)((ulong)((byte)(uVar58 >> 1) & 1) * *(long *)((long)local_118.m_data + uVar61 + 8))
         * local_b8;
    auVar81._16_8_ =
         (double)((ulong)((byte)(uVar58 >> 2) & 1) *
                 *(long *)((long)local_118.m_data + uVar61 + 0x10)) * local_b8;
    auVar81._24_8_ = (double)((uVar58 >> 3) * *(long *)(auStack_f8 + (uVar61 - 8))) * local_b8;
    auVar62 = vsubpd_avx(auVar63,auVar81);
    puVar57 = (ulong *)((long)puVar57 + uVar61);
    bVar40 = (bool)((byte)(uVar58 >> 1) & 1);
    bVar41 = (bool)((byte)(uVar58 >> 2) & 1);
    *puVar57 = (ulong)(bVar39 & 1) * auVar62._0_8_ | (ulong)!(bool)(bVar39 & 1) * *puVar57;
    puVar57[1] = (ulong)bVar40 * auVar62._8_8_ | (ulong)!bVar40 * puVar57[1];
    puVar57[2] = (ulong)bVar41 * auVar62._16_8_ | (ulong)!bVar41 * puVar57[2];
    puVar57[3] = (uVar58 >> 3) * auVar62._24_8_ | (ulong)!SUB81(uVar58 >> 3,0) * puVar57[3];
  }
  return;
}

Assistant:

void ChLinkMarkers::ConstraintsFbLoadForces(double factor) {
    if (!Body1 || !Body2)
        return;

    if (Vnotnull(C_force)) {
        Vector mbody_force;
        Vector mbody_torque;
        Vector m_abs_force = Body2->GetA() * (marker2->GetA() * C_force);

        Body2->To_abs_forcetorque(m_abs_force,
                                  marker1->GetAbsCoord().pos,  // absolute application point is always marker1
                                  false,                       // from abs. space
                                  mbody_force, mbody_torque);  // resulting force-torque, both in abs coords
        Body2->Variables().Get_fb().segment(0, 3) -= factor * mbody_force.eigen();
        Body2->Variables().Get_fb().segment(3, 3) -=
            factor * Body2->TransformDirectionParentToLocal(mbody_torque).eigen();

        Body1->To_abs_forcetorque(m_abs_force,
                                  marker1->GetAbsCoord().pos,  // absolute application point is always marker1
                                  false,                       // from abs. space
                                  mbody_force, mbody_torque);  // resulting force-torque, both in abs coords
        Body1->Variables().Get_fb().segment(0, 3) += factor * mbody_force.eigen();
        Body1->Variables().Get_fb().segment(3, 3) +=
            factor * Body1->TransformDirectionParentToLocal(mbody_torque).eigen();
    }

    if (Vnotnull(C_torque)) {
        Vector m_abs_torque = Body2->GetA() * (marker2->GetA() * C_torque);
        // load torques in 'fb' vector accumulator of body variables (torques in local coords)
        Body1->Variables().Get_fb().segment(3, 3) +=
            factor * Body1->TransformDirectionParentToLocal(m_abs_torque).eigen();
        Body2->Variables().Get_fb().segment(3, 3) -=
            factor * Body2->TransformDirectionParentToLocal(m_abs_torque).eigen();
    }
}